

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::StackIRGenerator::emit(StackIRGenerator *this,Expression *curr)

{
  bool bVar1;
  value_type local_20;
  StackInst *stackInst;
  Expression *curr_local;
  StackIRGenerator *this_local;
  
  local_20 = (value_type)0x0;
  stackInst = (StackInst *)curr;
  curr_local = (Expression *)this;
  bVar1 = Expression::is<wasm::Block>(curr);
  if (bVar1) {
    local_20 = makeStackInst(this,BlockBegin,(Expression *)stackInst);
  }
  else {
    bVar1 = Expression::is<wasm::If>((Expression *)stackInst);
    if (bVar1) {
      local_20 = makeStackInst(this,IfBegin,(Expression *)stackInst);
    }
    else {
      bVar1 = Expression::is<wasm::Loop>((Expression *)stackInst);
      if (bVar1) {
        local_20 = makeStackInst(this,LoopBegin,(Expression *)stackInst);
      }
      else {
        bVar1 = Expression::is<wasm::Try>((Expression *)stackInst);
        if (bVar1) {
          local_20 = makeStackInst(this,TryBegin,(Expression *)stackInst);
        }
        else {
          bVar1 = Expression::is<wasm::TryTable>((Expression *)stackInst);
          if (bVar1) {
            local_20 = makeStackInst(this,TryTableBegin,(Expression *)stackInst);
          }
          else {
            local_20 = makeStackInst(this,(Expression *)stackInst);
          }
        }
      }
    }
  }
  std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::push_back
            (&this->stackIR,&local_20);
  return;
}

Assistant:

void StackIRGenerator::emit(Expression* curr) {
  StackInst* stackInst = nullptr;
  if (curr->is<Block>()) {
    stackInst = makeStackInst(StackInst::BlockBegin, curr);
  } else if (curr->is<If>()) {
    stackInst = makeStackInst(StackInst::IfBegin, curr);
  } else if (curr->is<Loop>()) {
    stackInst = makeStackInst(StackInst::LoopBegin, curr);
  } else if (curr->is<Try>()) {
    stackInst = makeStackInst(StackInst::TryBegin, curr);
  } else if (curr->is<TryTable>()) {
    stackInst = makeStackInst(StackInst::TryTableBegin, curr);
  } else {
    stackInst = makeStackInst(curr);
  }
  stackIR.push_back(stackInst);
}